

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O3

void __thiscall
embree::sse2::SubdivMeshISA::interpolateN(SubdivMeshISA *this,RTCInterpolateNArguments *args)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  RawBufferView *pRVar4;
  void *pvVar5;
  uint *puVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  char *pcVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  longlong lVar21;
  longlong lVar22;
  uint uVar23;
  int iVar24;
  int extraout_EAX;
  ulong dstride;
  pointer pvVar25;
  ulong uVar26;
  size_t N;
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  *pvVar27;
  ulong stride;
  ulong uVar28;
  float *ddPdudv;
  float *ddPdudu;
  uint uVar29;
  Topology *pTVar30;
  float *P;
  float *dPdu;
  float *ddPdvdv;
  float *dPdv;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  size_t slots;
  uint local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  vfloat4 vv;
  vfloat4 uu;
  vuint4 primID;
  vboolf_impl<4> valid2;
  PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
  local_70;
  
  uVar2 = args->N;
  dstride = (ulong)uVar2;
  uVar23 = args->bufferSlot;
  if (args->bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    pRVar4 = (this->super_SubdivMesh).vertexAttribs.items;
    pvVar27 = &(this->super_SubdivMesh).vertex_attrib_buffer_tags;
    pTVar30 = (this->super_SubdivMesh).topology.items + pRVar4[uVar23].userData;
  }
  else {
    pRVar4 = &((this->super_SubdivMesh).vertices.items)->super_RawBufferView;
    pvVar27 = &(this->super_SubdivMesh).vertex_buffer_tags;
    pTVar30 = (this->super_SubdivMesh).topology.items;
  }
  if (dstride != 0) {
    pvVar5 = args->valid;
    puVar6 = args->primIDs;
    pfVar7 = args->u;
    pfVar8 = args->v;
    pfVar9 = args->P;
    pfVar10 = args->dPdu;
    pfVar11 = args->dPdv;
    pfVar12 = args->ddPdudu;
    pfVar13 = args->ddPdvdv;
    pfVar14 = args->ddPdudv;
    uVar3 = args->valueCount;
    pvVar25 = (pvVar27->
              super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + uVar23;
    stride = (ulong)(uint)pRVar4[uVar23].stride;
    pcVar15 = pRVar4[uVar23].ptr_ofs;
    uVar28 = 0;
    uVar23 = uVar2 * 4;
    do {
      uVar33 = (uint)uVar28;
      if (pvVar5 == (void *)0x0) {
        bVar17 = (int)uVar33 < (int)uVar2;
        bVar18 = (int)(uVar33 | 1) < (int)uVar2;
        bVar19 = (int)(uVar33 | 2) < (int)uVar2;
        bVar20 = (int)(uVar33 | 3) < (int)uVar2;
      }
      else {
        piVar1 = (int *)((long)pvVar5 + uVar28 * 4);
        bVar17 = *piVar1 == -1 && (int)uVar33 < (int)uVar2;
        bVar18 = piVar1[1] == -1 && (int)(uVar33 | 1) < (int)uVar2;
        bVar19 = piVar1[2] == -1 && (int)(uVar33 | 2) < (int)uVar2;
        bVar20 = piVar1[3] == -1 && (int)(uVar33 | 3) < (int)uVar2;
      }
      auVar35._0_4_ = (uint)bVar17 * -0x80000000;
      auVar35._4_4_ = (uint)bVar18 * -0x80000000;
      auVar35._8_4_ = (uint)bVar19 * -0x80000000;
      auVar35._12_4_ = (uint)bVar20 * -0x80000000;
      uVar23 = movmskps(uVar23,auVar35);
      if (uVar23 != 0) {
        lVar21 = *(longlong *)(puVar6 + uVar28);
        lVar22 = *(longlong *)(puVar6 + uVar28 + 2);
        primID.field_0.v[0] = lVar21;
        primID.field_0.v[1] = lVar22;
        uu.field_0._0_8_ = *(undefined8 *)(pfVar7 + uVar28);
        uu.field_0._8_8_ = *(undefined8 *)(pfVar7 + uVar28 + 2);
        vv.field_0._0_8_ = *(undefined8 *)(pfVar8 + uVar28);
        vv.field_0._8_8_ = *(undefined8 *)(pfVar8 + uVar28 + 2);
        auVar36._0_4_ = auVar35._0_4_ >> 0x1f;
        auVar36._4_4_ = auVar35._4_4_ >> 0x1f;
        auVar36._8_4_ = auVar35._8_4_ >> 0x1f;
        auVar36._12_4_ = auVar35._12_4_ >> 0x1f;
        do {
          lVar16 = 0;
          if ((uVar23 & 0xf) != 0) {
            for (; ((uVar23 & 0xf) >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          iVar24 = (int)lVar16;
          uVar23 = primID.field_0.i[iVar24];
          local_e8 = (uint)lVar21;
          uStack_e4 = (uint)((ulong)lVar21 >> 0x20);
          uStack_e0 = (uint)lVar22;
          uStack_dc = (uint)((ulong)lVar22 >> 0x20);
          auVar34._0_4_ = -(uint)(uVar23 == local_e8);
          auVar34._4_4_ = -(uint)(uVar23 == uStack_e4);
          auVar34._8_4_ = -(uint)(uVar23 == uStack_e0);
          auVar34._12_4_ = -(uint)(uVar23 == uStack_dc);
          valid2.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar34 & auVar36);
          if (uVar3 != 0) {
            uVar29 = 0;
            uVar32 = 0;
            uVar33 = uVar3;
            do {
              uVar26 = (uVar32 >> 2) + (stride + 0xf >> 4) * (ulong)uVar23;
              lVar16 = *(long *)&(pvVar25->
                                 super__Vector_base<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                                 )._M_impl.super__Vector_impl_data;
              if ((ulong)((long)*(pointer *)
                                 ((long)&(pvVar25->
                                         super__Vector_base<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                                         )._M_impl.super__Vector_impl_data + 8) - lVar16 >> 4) <=
                  uVar26) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar26);
              }
              N = 4;
              if (uVar33 < 4) {
                N = (size_t)uVar33;
              }
              P = pfVar9 + uVar28 + uVar29;
              if (pfVar9 == (float *)0x0) {
                P = (float *)0x0;
              }
              dPdu = pfVar10 + uVar28 + uVar29;
              if (pfVar10 == (float *)0x0) {
                dPdu = (float *)0x0;
              }
              dPdv = pfVar11 + uVar28 + uVar29;
              if (pfVar11 == (float *)0x0) {
                dPdv = (float *)0x0;
              }
              ddPdudu = pfVar12 + uVar28 + uVar29;
              if (pfVar12 == (float *)0x0) {
                ddPdudu = (float *)0x0;
              }
              ddPdvdv = pfVar13 + uVar28 + uVar29;
              if (pfVar13 == (float *)0x0) {
                ddPdvdv = (float *)0x0;
              }
              ddPdudv = pfVar14 + uVar28 + uVar29;
              if (pfVar14 == (float *)0x0) {
                ddPdudv = (float *)0x0;
              }
              PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
              ::PatchEvalSimd(&local_70,(CacheEntry *)(lVar16 + uVar26 * 0x10),
                              (this->super_SubdivMesh).commitCounter,
                              (pTVar30->halfEdges).items +
                              (pTVar30->mesh->faceStartEdge).items[uVar23],pcVar15 + uVar32 * 4,
                              stride,&valid2,&uu,&vv,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dstride,N);
              uVar31 = (int)uVar32 + 4;
              uVar32 = (ulong)uVar31;
              uVar29 = uVar29 + uVar2 * 4;
              uVar33 = uVar33 - 4;
              iVar24 = extraout_EAX;
            } while (uVar31 < uVar3);
          }
          auVar36 = auVar36 ^ auVar34 & auVar36;
          uVar23 = movmskps(iVar24,auVar36);
        } while (uVar23 != 0);
        uVar23 = 0;
      }
      uVar28 = uVar28 + 4;
    } while (uVar28 < dstride);
  }
  return;
}

Assistant:

void SubdivMeshISA::interpolateN(const RTCInterpolateNArguments* const args)
    {
      const void* valid_i = args->valid;
      const unsigned* primIDs = args->primIDs;
      const float* u = args->u;
      const float* v = args->v;
      unsigned int N = args->N;
      RTCBufferType bufferType = args->bufferType;
      unsigned int bufferSlot = args->bufferSlot;
      float* P = args->P;
      float* dPdu = args->dPdu;
      float* dPdv = args->dPdv;
      float* ddPdudu = args->ddPdudu;
      float* ddPdvdv = args->ddPdvdv;
      float* ddPdudv = args->ddPdudv;
      unsigned int valueCount = args->valueCount;
    
      /* calculate base pointer and stride */
      assert((bufferType == RTC_BUFFER_TYPE_VERTEX && bufferSlot < RTC_MAX_TIME_STEP_COUNT) ||
             (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE && bufferSlot < RTC_MAX_USER_VERTEX_BUFFERS));
      const char* src = nullptr; 
      size_t stride = 0;
      std::vector<SharedLazyTessellationCache::CacheEntry>* baseEntry = nullptr;
      Topology* topo = nullptr;
      if (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
        assert(bufferSlot < vertexAttribs.size());
        src    = vertexAttribs[bufferSlot].getPtr();
        stride = vertexAttribs[bufferSlot].getStride();
        baseEntry = &vertex_attrib_buffer_tags[bufferSlot];
        int topologyID = vertexAttribs[bufferSlot].userData;
        topo = &topology[topologyID];
      } else {
        assert(bufferSlot < numTimeSteps);
        src    = vertices[bufferSlot].getPtr();
        stride = vertices[bufferSlot].getStride();
        baseEntry = &vertex_buffer_tags[bufferSlot];
        topo = &topology[0];
      }
      
      const int* valid = (const int*) valid_i;
      
      for (size_t i=0; i<N; i+=4) 
      {
        vbool4 valid1 = vint4(int(i))+vint4(step) < vint4(int(N));
        if (valid) valid1 &= vint4::loadu(&valid[i]) == vint4(-1);
        if (none(valid1)) continue;
        
        const vuint4 primID = vuint4::loadu(&primIDs[i]);
        const vfloat4 uu = vfloat4::loadu(&u[i]);
        const vfloat4 vv = vfloat4::loadu(&v[i]);
        
        foreach_unique(valid1,primID,[&](const vbool4& valid1, const unsigned int primID)
                       {
                         for (unsigned int j=0; j<valueCount; j+=4) 
                         {
                           const size_t M = min(4u,valueCount-j);
                           isa::PatchEvalSimd<vbool4,vint4,vfloat4,vfloat4>(baseEntry->at(interpolationSlot(primID,j/4,stride)),commitCounter,
                                                                            topo->getHalfEdge(primID),src+j*sizeof(float),stride,valid1,uu,vv,
                                                                            P ? P+j*N+i : nullptr,
                                                                            dPdu ? dPdu+j*N+i : nullptr,
                                                                            dPdv ? dPdv+j*N+i : nullptr,
                                                                            ddPdudu ? ddPdudu+j*N+i : nullptr,
                                                                            ddPdvdv ? ddPdvdv+j*N+i : nullptr,
                                                                            ddPdudv ? ddPdudv+j*N+i : nullptr,
                                                                            N,M);
                         }
                       });
      }
    }